

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# charconv_bigint.h
# Opt level: O0

void __thiscall
absl::strings_internal::BigUnsigned<4>::AddWithCarry(BigUnsigned<4> *this,int index,uint32_t value)

{
  bool bVar1;
  int *piVar2;
  int local_20 [3];
  int local_14;
  uint32_t value_local;
  int index_local;
  BigUnsigned<4> *this_local;
  
  local_20[2] = value;
  local_14 = index;
  if (value != 0) {
    while (local_14 < 4 && local_20[2] != 0) {
      this->words_[local_14] = local_20[2] + this->words_[local_14];
      bVar1 = this->words_[local_14] < (uint)local_20[2];
      if (bVar1) {
        local_14 = local_14 + 1;
      }
      local_20[2] = (int)bVar1;
    }
    local_20[1] = 4;
    local_20[0] = local_14 + 1;
    _value_local = this;
    piVar2 = std::max<int>(local_20,&this->size_);
    piVar2 = std::min<int>(local_20 + 1,piVar2);
    this->size_ = *piVar2;
  }
  return;
}

Assistant:

void AddWithCarry(int index, uint32_t value) {
    if (value) {
      while (index < max_words && value > 0) {
        words_[index] += value;
        // carry if we overflowed in this word:
        if (value > words_[index]) {
          value = 1;
          ++index;
        } else {
          value = 0;
        }
      }
      size_ = (std::min)(max_words, (std::max)(index + 1, size_));
    }
  }